

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# password.c
# Opt level: O2

int to_base64(char *str,size_t str_len,size_t out_len)

{
  char cVar1;
  void *__ptr;
  int iVar2;
  size_t sVar3;
  ulong uVar4;
  char cVar5;
  uint uVar6;
  long lVar7;
  char *pcVar8;
  int iVar9;
  
  iVar9 = 0;
  __ptr = malloc(((str_len * 4) / 3 + 3 & 0x7ffffffffffffffc) + 1);
  if (__ptr == (void *)0x0) {
    out_len = 0xffffffffffffffff;
    if (-1 < msgno) {
      fwrite("password_hash: memory allocate\n",0x1f,1,_stderr);
    }
  }
  else {
    uVar6 = 0;
    iVar2 = 0;
    for (sVar3 = 0; lVar7 = (long)iVar9, sVar3 != str_len; sVar3 = sVar3 + 1) {
      uVar6 = (int)str[sVar3] | uVar6 << 8;
      iVar2 = iVar2 + 8;
      pcVar8 = (char *)(lVar7 + (long)__ptr);
      while (5 < iVar2) {
        iVar2 = iVar2 + -6;
        *pcVar8 = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
                  [(int)uVar6 >> ((byte)iVar2 & 0x1f) & 0x3f];
        iVar9 = iVar9 + 1;
        pcVar8 = pcVar8 + 1;
      }
    }
    if (0 < iVar2) {
      iVar9 = iVar9 + 1;
      *(char *)((long)__ptr + lVar7) =
           "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
           [uVar6 << (6U - (char)iVar2 & 0x1f) & 0x3f];
    }
    uVar4 = (ulong)iVar9;
    lVar7 = uVar4 << 0x20;
    for (; (uVar4 & 3) != 0; uVar4 = uVar4 + 1) {
      *(undefined1 *)((long)__ptr + uVar4) = 0x3d;
      lVar7 = lVar7 + 0x100000000;
    }
    if ((ulong)(lVar7 >> 0x20) < out_len) {
LAB_0010197a:
      free(__ptr);
      out_len = 0xffffffffffffffff;
    }
    else {
      for (sVar3 = 0; out_len != sVar3; sVar3 = sVar3 + 1) {
        cVar1 = *(char *)((long)__ptr + sVar3);
        cVar5 = '.';
        if ((cVar1 != '+') && (cVar5 = cVar1, cVar1 == '=')) goto LAB_0010197a;
        str[sVar3] = cVar5;
      }
      free(__ptr);
    }
  }
  return (int)out_len;
}

Assistant:

static int
to_base64(char *str, size_t str_len, const size_t out_len)
{
    char *b = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/";
    char *buffer;
    size_t i;
    int n = 0, x = 0, l = 0;

    buffer = (char *)malloc(((str_len * 4 / 3 + 3) & ~0x03) + 1);
    if (!buffer) {
        msg_error(hash, "memory allocate\n");
        return -1;
    }

    for (i = 0; i < str_len; i++) {
        x = x << 8 | str[i];
        for (l += 8; l >= 6; l -= 6) {
            buffer[n++] = b[(x >> (l - 6)) & 0x3f];
        }
    }

    if (l > 0) {
        x <<= 6 - l;
        buffer[n++] = b[x & 0x3f];
    }

    for (; n % 4;) {
        buffer[n++] = '=';
    }

    if ((size_t)n < out_len) {
        free(buffer);
        return -1;
    }

    for (i = 0; i < out_len; i++) {
        if (buffer[i] == '+') {
            str[i] = '.';
        } else if (buffer[i] == '=') {
            free(buffer);
            return -1;
        } else {
            str[i] = buffer[i];
        }
    }

    free(buffer);

    return i;
}